

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall
CVmObjHTTPRequest::reload_from_image(CVmObjHTTPRequest *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  vm_httpreq_ext *pvVar1;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  pvVar1 = vm_httpreq_ext::alloc_ext(this);
  (this->super_CVmObject).ext_ = (char *)pvVar1;
  return;
}

Assistant:

void CVmObjHTTPRequest::reload_from_image(VMG_ vm_obj_id_t self,
                                          const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);
}